

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

FStateDefine * __thiscall FStateDefinitions::FindStateAddress(FStateDefinitions *this,char *name)

{
  undefined8 in_RAX;
  FStateDefine *pFVar1;
  uint i;
  ulong uVar2;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  MakeStateNameList(name);
  pFVar1 = (FStateDefine *)0x0;
  for (uVar2 = 0; uVar2 < MakeStateNameList::namelist.Count; uVar2 = uVar2 + 1) {
    uStack_28 = CONCAT44(MakeStateNameList::namelist.Array[uVar2].Index,(undefined4)uStack_28);
    pFVar1 = FindStateLabelInList(&this->StateLabels,(FName *)((long)&uStack_28 + 4),true);
    this = (FStateDefinitions *)&pFVar1->Children;
  }
  return pFVar1;
}

Assistant:

FStateDefine *FStateDefinitions::FindStateAddress(const char *name)
{
	FStateDefine *statedef = NULL;
	TArray<FName> &namelist = MakeStateNameList(name);
	TArray<FStateDefine> *statelist = &StateLabels;

	for(unsigned i = 0; i < namelist.Size(); i++)
	{
		statedef = FindStateLabelInList(*statelist, namelist[i], true);
		statelist = &statedef->Children;
	}
	return statedef;
}